

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

walk_result __thiscall
jsoncons::jsonschema::
all_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
do_walk(all_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance,
       json_pointer *instance_location,walk_reporter_type *reporter)

{
  string *name;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar1;
  long *plVar2;
  int iVar3;
  walk_result wVar4;
  size_t index;
  bool bVar5;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  item_context;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  this_context;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> local_a0
  ;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> local_68
  ;
  
  pbVar1 = (this->
           super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ).
           super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           .schema_ptr_;
  iVar3 = (*(this->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[6])();
  if (*(long *)(reporter + 0x10) == 0) {
    std::__throw_bad_function_call();
  }
  name = &(this->
          super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ).
          super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          .keyword_name_;
  iVar3 = (**(code **)(reporter + 0x18))(reporter,name,pbVar1,iVar3,instance,instance_location);
  wVar4 = abort;
  if (iVar3 != 1) {
    eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
    eval_context(&local_68,context,name);
    bVar5 = *(long *)&this->field_0xe8 !=
            *(long *)&(this->
                      super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      ).field_0xe0;
    if (bVar5) {
      index = 0;
      do {
        eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
        eval_context(&local_a0,&local_68,index);
        plVar2 = *(long **)(*(long *)&(this->
                                      super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                      ).field_0xe0 + index * 8);
        iVar3 = (**(code **)(*plVar2 + 0x30))(plVar2,&local_a0,instance,instance_location,reporter);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0.eval_path_.tokens_);
        if (local_a0.dynamic_scope_.
            super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a0.dynamic_scope_.
                                super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.dynamic_scope_.
                                super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar3 == 1) break;
        index = index + 1;
        bVar5 = index < (ulong)(*(long *)&this->field_0xe8 -
                                *(long *)&(this->
                                          super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                          ).field_0xe0 >> 3);
      } while (bVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68.eval_path_.tokens_);
    if (local_68.dynamic_scope_.
        super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.dynamic_scope_.
                      super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.dynamic_scope_.
                            super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.dynamic_scope_.
                            super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    wVar4 = (walk_result)bVar5;
  }
  return wVar4;
}

Assistant:

walk_result do_walk(const eval_context<Json>& context, const Json& instance,
            const jsonpointer::json_pointer& instance_location, const walk_reporter_type& reporter) const final
        {
            walk_result result = reporter(this->keyword_name(), this->schema(), this->schema_location(), instance, instance_location);
            if (result == walk_result::abort)
            {
                return result;
            }
            eval_context<Json> this_context(context, this->keyword_name());

            for (std::size_t i = 0; i < validators_.size(); ++i) 
            {
                eval_context<Json> item_context(this_context, i);

                result = validators_[i]->walk(item_context, instance, instance_location, reporter);
                if (result == walk_result::abort)
                {
                    return result;
                }
            }

            return walk_result::advance;
        }